

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketInitiator.cpp
# Opt level: O2

void __thiscall
FIX::ThreadedSocketInitiator::doConnect(ThreadedSocketInitiator *this,SessionID *s,Dictionary *d)

{
  NullLog *pNVar1;
  short sourcePort_00;
  short port_00;
  bool bVar2;
  socket_handle s_00;
  Session *pSVar3;
  ThreadedSocketConnection *this_00;
  undefined8 *var;
  signed_int value;
  signed_int value_00;
  NullLog *pLog;
  Log *pLVar4;
  short sourcePort;
  short port;
  string address;
  thread_id thread;
  string sourceAddress;
  string local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pSVar3 = Session::lookupSession(s);
  UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&address);
  bVar2 = TimeRange::isInRange(&pSVar3->m_sessionTime,(UtcTimeStamp *)&address);
  if (bVar2) {
    address._M_dataplus._M_p = (pointer)&address.field_2;
    address._M_string_length = 0;
    port = 0;
    address.field_2._M_local_buf[0] = '\0';
    sourceAddress._M_dataplus._M_p = (pointer)&sourceAddress.field_2;
    sourceAddress._M_string_length = 0;
    sourceAddress.field_2._M_local_buf[0] = '\0';
    sourcePort = 0;
    getHost(this,s,d,&address,&port,&sourceAddress,&sourcePort);
    s_00 = socket_createConnector();
    if (this->m_noDelay == true) {
      socket_setsockopt(s_00,1);
    }
    if (this->m_sendBufSize != 0) {
      socket_setsockopt(s_00,7,this->m_sendBufSize);
    }
    if (this->m_rcvBufSize != 0) {
      socket_setsockopt(s_00,8,this->m_rcvBufSize);
    }
    Initiator::setPending(&this->super_Initiator,s);
    std::operator+(&local_110,"Connecting to ",&address);
    std::operator+(&local_f0,&local_110," on port ");
    port_00 = port;
    IntConvertor::convert_abi_cxx11_(&local_130,(IntConvertor *)(ulong)(ushort)port,value);
    std::operator+(&local_d0,&local_f0,&local_130);
    std::operator+(&local_b0,&local_d0," (Source ");
    std::operator+(&local_90,&local_b0,&sourceAddress);
    std::operator+(&local_70,&local_90,":");
    sourcePort_00 = sourcePort;
    IntConvertor::convert_abi_cxx11_(&local_150,(IntConvertor *)(ulong)(ushort)sourcePort,value_00);
    std::operator+(&local_50,&local_70,&local_150);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&thread,
                   &local_50,")");
    pLVar4 = &(pSVar3->m_state).super_Log;
    (*pLVar4->_vptr_Log[6])(pLVar4,&thread);
    std::__cxx11::string::~string((string *)&thread);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    this_00 = (ThreadedSocketConnection *)operator_new(0x2148);
    pNVar1 = (NullLog *)(this->super_Initiator).m_pLog;
    pLog = &(this->super_Initiator).m_nullLog;
    if (pNVar1 != (NullLog *)0x0) {
      pLog = pNVar1;
    }
    ThreadedSocketConnection::ThreadedSocketConnection
              (this_00,s,s_00,&address,port_00,&pLog->super_Log,&sourceAddress,sourcePort_00);
    var = (undefined8 *)operator_new(0x10);
    *var = this;
    var[1] = this_00;
    Mutex::lock(&this->m_mutex);
    bVar2 = thread_spawn(socketThread,var,&thread);
    if (bVar2) {
      addThread(this,s_00,thread);
    }
    else {
      operator_delete(var,0x10);
      (*(this_00->super_Responder)._vptr_Responder[3])(this_00);
      (*(this_00->super_Responder)._vptr_Responder[1])(this_00);
      Initiator::setDisconnected(&this->super_Initiator,s);
    }
    Mutex::unlock(&this->m_mutex);
    std::__cxx11::string::~string((string *)&sourceAddress);
    std::__cxx11::string::~string((string *)&address);
  }
  return;
}

Assistant:

void ThreadedSocketInitiator::doConnect( const SessionID& s, const Dictionary& d )
{
  try
  {
    Session* session = Session::lookupSession( s );
    if( !session->isSessionTime(UtcTimeStamp()) ) return;

    Log* log = session->getLog();

    std::string address;
    short port = 0;
    std::string sourceAddress;
    short sourcePort = 0;
    getHost( s, d, address, port, sourceAddress, sourcePort );

    socket_handle socket = socket_createConnector();
    if( m_noDelay )
      socket_setsockopt( socket, TCP_NODELAY );
    if( m_sendBufSize )
      socket_setsockopt( socket, SO_SNDBUF, m_sendBufSize );
    if( m_rcvBufSize )
      socket_setsockopt( socket, SO_RCVBUF, m_rcvBufSize );

    setPending( s );
    log->onEvent( "Connecting to " + address + " on port " + IntConvertor::convert((unsigned short)port) + " (Source " + sourceAddress + ":" + IntConvertor::convert((unsigned short)sourcePort) + ")");

    ThreadedSocketConnection* pConnection =
      new ThreadedSocketConnection( s, socket, address, port, getLog(), sourceAddress, sourcePort );

    ThreadPair* pair = new ThreadPair( this, pConnection );

    {
      Locker l( m_mutex );
      thread_id thread;
      if ( thread_spawn( &socketThread, pair, thread ) )
      {
        addThread( socket, thread );
      }
      else
      {
        delete pair;
        pConnection->disconnect();
        delete pConnection;
        setDisconnected( s );
      }
    }
  }
  catch ( std::exception& ) {}
}